

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::RenderTestCase::iterate(RenderTestCase *this)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  RenderTarget *pRVar3;
  NotSupportedError *this_01;
  allocator<char> local_241;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [384];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = pRVar3->m_height;
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Render target size: ");
  std::ostream::operator<<(this_00,iVar1);
  std::operator<<((ostream *)this_00,"x");
  std::ostream::operator<<(this_00,iVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  if ((199 < iVar1) && (199 < iVar2)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Render target size must be at least ",&local_241);
  de::toString<int>(&local_220,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+(&local_1e0,&local_200,&local_220);
  std::operator+(&local_1c0,&local_1e0,"x");
  de::toString<int>(&local_240,&Functional::(anonymous_namespace)::TEST_CANVAS_SIZE);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 &local_1c0,&local_240);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1a0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RenderTestCase::IterateResult RenderTestCase::iterate (void)
{
	const int width	 = m_context.getRenderTarget().getWidth();
	const int height = m_context.getRenderTarget().getHeight();

	m_testCtx.getLog() << TestLog::Message << "Render target size: " << width << "x" << height << TestLog::EndMessage;
	if (width < TEST_CANVAS_SIZE || height < TEST_CANVAS_SIZE)
		throw tcu::NotSupportedError(std::string("Render target size must be at least ") + de::toString(TEST_CANVAS_SIZE) + "x" + de::toString(TEST_CANVAS_SIZE));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // success by default
	testRender();

	return STOP;
}